

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int checkday(char *check,size_t len)

{
  bool bVar1;
  int iVar2;
  int local_30;
  char **ppcStack_28;
  _Bool found;
  char **what;
  int i;
  size_t len_local;
  char *check_local;
  
  bVar1 = false;
  if (len < 4) {
    ppcStack_28 = Curl_wkday;
  }
  else {
    ppcStack_28 = weekday;
  }
  what._4_4_ = 0;
  do {
    if (6 < what._4_4_) {
LAB_00995f52:
      if (bVar1) {
        local_30 = what._4_4_;
      }
      else {
        local_30 = -1;
      }
      return local_30;
    }
    iVar2 = Curl_strcasecompare(check,*ppcStack_28);
    if (iVar2 != 0) {
      bVar1 = true;
      goto LAB_00995f52;
    }
    ppcStack_28 = ppcStack_28 + 1;
    what._4_4_ = what._4_4_ + 1;
  } while( true );
}

Assistant:

static int checkday(const char *check, size_t len)
{
  int i;
  const char * const *what;
  bool found= FALSE;
  if(len > 3)
    what = &weekday[0];
  else
    what = &Curl_wkday[0];
  for(i=0; i<7; i++) {
    if(strcasecompare(check, what[0])) {
      found=TRUE;
      break;
    }
    what++;
  }
  return found?i:-1;
}